

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

bool __thiscall Escape::CGraph::isEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = this->offsets[v1];
  lVar1 = this->offsets[v1 + 1];
  if (lVar1 <= lVar3) {
    return false;
  }
  lVar1 = lVar1 + -1;
  do {
    lVar2 = (lVar1 + lVar3) / 2;
    bVar4 = this->nbors[lVar2] == v2;
    if (bVar4) {
      return bVar4;
    }
    if (bVar4 || this->nbors[lVar2] < v2) {
      lVar3 = lVar2 + 1;
    }
    else {
      lVar1 = lVar2 + -1;
    }
  } while (lVar3 <= lVar1);
  return bVar4;
}

Assistant:

bool CGraph::isEdgeBinary(VertexIdx v1, VertexIdx v2) const {
//     VertexIdx deg1 = offsets[v1+1] - offsets[v1];
//     VertexIdx deg2 = offsets[v2+1] - offsets[v2];

//     if(deg2 < deg1)
//     {
//         VertexIdx swp = v1;
//         v1 = v2;
//         v2 = swp;
//     }
//
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;

        if (nbors[mid] == v2)
            return true;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return false;
}